

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_asn1.cc
# Opt level: O2

int i2d_PUBKEY(EVP_PKEY *a,uchar **pp)

{
  int iVar1;
  CBB cbb;
  
  if (a == (EVP_PKEY *)0x0) {
    return 0;
  }
  iVar1 = CBB_init(&cbb,0x80);
  if ((iVar1 != 0) && (iVar1 = EVP_marshal_public_key(&cbb,(EVP_PKEY *)a), iVar1 != 0)) {
    iVar1 = CBB_finish_i2d(&cbb,pp);
    return iVar1;
  }
  CBB_cleanup(&cbb);
  return -1;
}

Assistant:

int i2d_PUBKEY(const EVP_PKEY *pkey, uint8_t **outp) {
  if (pkey == NULL) {
    return 0;
  }

  CBB cbb;
  if (!CBB_init(&cbb, 128) ||
      !EVP_marshal_public_key(&cbb, pkey)) {
    CBB_cleanup(&cbb);
    return -1;
  }
  return CBB_finish_i2d(&cbb, outp);
}